

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

long __thiscall minja::Value::get<long>(Value *this,string *key,long default_value)

{
  bool bVar1;
  Value *in_RDX;
  Value *in_stack_ffffffffffffff58;
  Value *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff88;
  Value *in_stack_ffffffffffffff90;
  Value *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffc0;
  Value *in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  bVar1 = contains(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  local_8 = in_RDX;
  if (bVar1) {
    Value(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    at(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_8 = (Value *)get<long>(in_stack_ffffffffffffffb0);
    ~Value(local_8);
  }
  return (long)local_8;
}

Assistant:

T get(const std::string & key, T default_value) const {
    if (!contains(key)) return default_value;
    return at(key).get<T>();
  }